

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c.cpp
# Opt level: O3

size_t fs_which(char *name,char *path,bool find_all,char *result,size_t buffer_size)

{
  size_t sVar1;
  size_t sVar2;
  size_type sVar3;
  string_view s;
  string_view name_00;
  string_view path_00;
  string local_50;
  
  sVar1 = strlen(name);
  sVar2 = strlen(path);
  name_00._M_str = name;
  name_00._M_len = sVar1;
  path_00._M_str = path;
  path_00._M_len = sVar2;
  fs_which_abi_cxx11_(&local_50,name_00,path_00,find_all);
  s._M_str = local_50._M_dataplus._M_p;
  s._M_len = local_50._M_string_length;
  sVar3 = fs_str2char(s,result,buffer_size);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return sVar3;
}

Assistant:

size_t fs_which(const char* name, const char* path, const bool find_all, char* result, const size_t buffer_size){
  return fs_str2char(fs_which(name, path, find_all), result, buffer_size);
}